

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_attribute_corner_table.h
# Opt level: O2

void draco::GetParallelogramEntries<draco::MeshAttributeCornerTable>
               (CornerIndex ci,MeshAttributeCornerTable *table,
               vector<int,_std::allocator<int>_> *vertex_to_data_map,int *opp_entry,int *next_entry,
               int *prev_entry)

{
  pointer pIVar1;
  pointer piVar2;
  uint uVar3;
  ulong uVar4;
  
  pIVar1 = (table->corner_to_vertex_map_).
           super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar2 = (vertex_to_data_map->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  *opp_entry = piVar2[pIVar1[ci.value_].value_];
  if (ci.value_ == 0xffffffff) {
    *next_entry = piVar2[pIVar1[0xffffffff].value_];
    uVar4 = 0xffffffffffffffff;
  }
  else {
    uVar3 = ci.value_ - 2;
    if ((ci.value_ + 1) % 3 != 0) {
      uVar3 = ci.value_ + 1;
    }
    *next_entry = piVar2[pIVar1[uVar3].value_];
    if (ci.value_ % 3 == 0) {
      uVar4 = (ulong)(ci.value_ + 2);
    }
    else {
      uVar4 = (ulong)(ci.value_ - 1);
    }
  }
  *prev_entry = piVar2[pIVar1[uVar4 & 0xffffffff].value_];
  return;
}

Assistant:

VertexIndex ConfidentVertex(CornerIndex corner) const {
    return corner_to_vertex_map_[corner.value()];
  }